

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O2

void Ssw_MatchingComplete(Aig_Man_t *p0,Aig_Man_t *p1)

{
  Vec_Ptr_t *p;
  void *Entry;
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  Aig_Obj_t *p1_00;
  int iVar5;
  int iVar6;
  int i;
  
  p = Vec_PtrAlloc(100);
  for (iVar5 = 0; iVar5 < p0->nRegs; iVar5 = iVar5 + 1) {
    Entry = Vec_PtrEntry(p0->vCos,p0->nTruePos + iVar5);
    pvVar1 = Vec_PtrEntry(p0->vCis,p0->nTruePis + iVar5);
    if (*(long *)((long)pvVar1 + 0x28) == 0) {
      pAVar2 = Aig_ObjCreateCi(p1);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
      (pAVar2->field_5).pData = pvVar1;
      Vec_PtrPush(p,Entry);
    }
  }
  iVar5 = 0;
  do {
    if (p0->vObjs->nSize <= iVar5) {
      iVar5 = p->nSize;
      iVar6 = 0;
      i = 0;
      if (0 < iVar5) {
        iVar6 = iVar5;
        i = 0;
      }
      for (; iVar6 != i; i = i + 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p,i);
        pAVar2 = Aig_ObjChild0Copy(pAVar2);
        Aig_ObjCreateCo(p1,pAVar2);
      }
      Aig_ManSetRegNum(p1,iVar5 + p1->nRegs);
      Vec_PtrFree(p);
      return;
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,iVar5);
    if (((pAVar2 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar2->field_0x18 & 7) - 7)) &&
       ((pAVar2->field_5).pData == (void *)0x0)) {
      pAVar3 = Aig_ObjChild0Copy(pAVar2);
      if (((ulong)pAVar2 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
      }
      uVar4 = (ulong)pAVar2->pFanin1 & 0xfffffffffffffffe;
      if (uVar4 == 0) {
        p1_00 = (Aig_Obj_t *)0x0;
      }
      else {
        p1_00 = (Aig_Obj_t *)((ulong)((uint)pAVar2->pFanin1 & 1) ^ *(ulong *)(uVar4 + 0x28));
      }
      pAVar3 = Aig_And(p1,pAVar3,p1_00);
      (pAVar2->field_5).pData = pAVar3;
      (pAVar3->field_5).pData = pAVar2;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Ssw_MatchingComplete( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Ptr_t * vNewLis;
    Aig_Obj_t * pObj0, * pObj0Li, * pObj1;
    int i;
    // create register outputs in p0 that are absent in p1
    vNewLis = Vec_PtrAlloc( 100 );
    Saig_ManForEachLiLo( p0, pObj0Li, pObj0, i )
    {
        if ( pObj0->pData != NULL )
            continue;
        pObj1 = Aig_ObjCreateCi( p1 );
        pObj0->pData = pObj1;
        pObj1->pData = pObj0;
        Vec_PtrPush( vNewLis, pObj0Li );
    }
    // add missing nodes in the topological order
    Aig_ManForEachNode( p0, pObj0, i )
    {
        if ( pObj0->pData != NULL )
            continue;
        pObj1 = Aig_And( p1, Aig_ObjChild0Copy(pObj0), Aig_ObjChild1Copy(pObj0) );
        pObj0->pData = pObj1;
        pObj1->pData = pObj0;
    }
    // create register outputs in p0 that are absent in p1
    Vec_PtrForEachEntry( Aig_Obj_t *, vNewLis, pObj0Li, i )
        Aig_ObjCreateCo( p1, Aig_ObjChild0Copy(pObj0Li) );
    // increment the number of registers
    Aig_ManSetRegNum( p1, Aig_ManRegNum(p1) + Vec_PtrSize(vNewLis) );
    Vec_PtrFree( vNewLis );
}